

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

void Gia_Iso2ManPropagate(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_24 = 1;
  while( true ) {
    bVar5 = false;
    if (local_24 < p->nObjs) {
      pObjRo = Gia_ManObj(p,local_24);
      bVar5 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar3 = Gia_ObjIsAnd(pObjRo);
    if (iVar3 == 0) {
      iVar3 = Gia_ObjIsCo(pObjRo);
      if (iVar3 != 0) {
        iVar3 = Gia_ObjFaninC0(pObjRo);
        iVar3 = iVar3 + s_PrimeC;
        pGVar4 = Gia_ObjFanin0(pObjRo);
        pObjRo->Value = iVar3 * pGVar4->Value + pObjRo->Value;
      }
    }
    else {
      iVar3 = Gia_ObjFaninC0(pObjRo);
      iVar3 = iVar3 + s_PrimeC;
      pGVar4 = Gia_ObjFanin0(pObjRo);
      uVar1 = pGVar4->Value;
      iVar2 = Gia_ObjFaninC1(pObjRo);
      iVar2 = iVar2 + s_PrimeC;
      pGVar4 = Gia_ObjFanin1(pObjRo);
      pObjRo->Value = iVar3 * uVar1 + iVar2 * pGVar4->Value + pObjRo->Value;
      iVar3 = Gia_ObjFaninC0(pObjRo);
      iVar2 = Gia_ObjFaninC1(pObjRo);
      if (iVar3 == iVar2) {
        pGVar4 = Gia_ObjFanin0(pObjRo);
        uVar1 = pGVar4->Value;
        pGVar4 = Gia_ObjFanin1(pObjRo);
        if (uVar1 == pGVar4->Value) {
          pObjRo->Value = s_256Primes[0xf4] + pObjRo->Value;
        }
      }
    }
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(p);
    bVar5 = false;
    if (local_24 < iVar3) {
      iVar3 = Gia_ManPoNum(p);
      pObjRo = Gia_ManCo(p,iVar3 + local_24);
      bVar5 = false;
      if (pObjRo != (Gia_Obj_t *)0x0) {
        iVar3 = Gia_ManPiNum(p);
        pGStack_20 = Gia_ManCi(p,iVar3 + local_24);
        bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar5) break;
    pGStack_20->Value = pObjRo->Value + pGStack_20->Value;
    pGVar4 = Gia_ObjFanin0(pObjRo);
    if (pGStack_20 == pGVar4) {
      pGStack_20->Value = s_256Primes[0xf3] + pGStack_20->Value;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Gia_Iso2ManPropagate( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pObjRo;
    int i;
    Gia_ManForEachObj1( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
        {
            pObj->Value += (Gia_ObjFaninC0(pObj) + s_PrimeC) * Gia_ObjFanin0(pObj)->Value + (Gia_ObjFaninC1(pObj) + s_PrimeC) * Gia_ObjFanin1(pObj)->Value;
            if ( Gia_ObjFaninC0(pObj) == Gia_ObjFaninC1(pObj) && Gia_ObjFanin0(pObj)->Value == Gia_ObjFanin1(pObj)->Value )
                pObj->Value += s_256Primes[ISO_MASK - 11];
        }
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value += (Gia_ObjFaninC0(pObj) + s_PrimeC) * Gia_ObjFanin0(pObj)->Value;
    Gia_ManForEachRiRo( p, pObj, pObjRo, i )
    {
        pObjRo->Value += pObj->Value;
        if ( pObjRo == Gia_ObjFanin0(pObj) )
            pObjRo->Value += s_256Primes[ISO_MASK - 12];
    }
}